

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  vector<int,_std::allocator<int>_> keys;
  string path;
  string cmd_1;
  PutDelayTest putDelayTest;
  _Vector_base<int,_std::allocator<int>_> local_27d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2798;
  string local_2778;
  string local_2758;
  PutDelayTest local_2738;
  
  std::__cxx11::string::string((string *)&local_27b8,"../data",(allocator *)&local_2738);
  std::__cxx11::string::string((string *)&local_2758,(string *)&local_27b8);
  bVar1 = utils::dirExists(&local_2758);
  std::__cxx11::string::~string((string *)&local_2758);
  if (bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2738,
                   "rm -rf ",&local_27b8);
    system((char *)local_2738._0_8_);
    std::__cxx11::string::~string((string *)&local_2738);
  }
  std::chrono::_V2::system_clock::now();
  PutDelayTest::PutDelayTest(&local_2738,1000,false);
  PutDelayTest::startTest((vector<int,_std::allocator<int>_> *)&local_27d0,&local_2738);
  GetDelayTest::startTest((vector<int,_std::allocator<int>_> *)&local_27d0);
  DeleteDelayTest::startTest((vector<int,_std::allocator<int>_> *)&local_27d0);
  std::__cxx11::string::string((string *)&local_2778,(string *)&local_27b8);
  bVar1 = utils::dirExists(&local_2778);
  std::__cxx11::string::~string((string *)&local_2778);
  if (bVar1) {
    std::operator+(&local_2798,"rm -rf ",&local_27b8);
    system(local_2798._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_2798);
  }
  std::chrono::_V2::system_clock::now();
  poVar2 = std::operator<<((ostream *)&std::cout,">>>>> Summary <<<<<");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"It takes ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2,"s to complete the test.");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_27d0);
  std::random_device::~random_device((random_device *)((long)&local_2738 + 8));
  std::__cxx11::string::~string((string *)&local_27b8);
  return 0;
}

Assistant:

int main() {
  string path = "../data";
  if (utils::dirExists(path)) {
    string cmd = "rm -rf " + path;
    system(cmd.c_str());
  }

  auto start = high_resolution_clock::now();
  PutDelayTest putDelayTest(1000, false);
  auto keys = putDelayTest.startTest();

  GetDelayTest::startTest(keys);
  DeleteDelayTest::startTest(keys);

  if (utils::dirExists(path)) {
    string cmd = "rm -rf " + path;
    system(cmd.c_str());
  }

  auto end = high_resolution_clock::now();
  auto totalTime = duration_cast<seconds>(end - start).count();

  cout << ">>>>> Summary <<<<<" << endl;
  cout << "It takes " << totalTime << "s to complete the test." << endl;
}